

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTHelperVisitors.cpp
# Opt level: O1

optional<std::basic_string_view<char,_std::char_traits<char>_>_> *
getIdentifier(optional<std::basic_string_view<char,_std::char_traits<char>_>_>
              *__return_storage_ptr__,Expression *expr)

{
  Type *pTVar1;
  char *pcVar2;
  Symbol *pSVar3;
  
  if (expr->kind == MemberAccess) {
    pTVar1 = expr[1].type.ptr;
    if ((pTVar1->super_Symbol).kind == ScalarType) {
      pSVar3 = *(Symbol **)&(pTVar1->super_Symbol).indexInScope;
    }
    else {
      pSVar3 = (Symbol *)0x0;
    }
  }
  else {
    pSVar3 = slang::ast::Expression::getSymbolReference(expr,true);
  }
  if (pSVar3 != (Symbol *)0x0) {
    pcVar2 = (pSVar3->name)._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = (pSVar3->name)._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar2;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = pSVar3 != (Symbol *)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> getIdentifier(const slang::ast::Expression& expr) {
    const slang::ast::Symbol* symbol = nullptr;
    if (slang::ast::MemberAccessExpression::isKind(expr.kind)) {
        auto& memberAccess = expr.as<slang::ast::MemberAccessExpression>();
        if (slang::ast::NamedValueExpression::isKind(memberAccess.value().kind))
            symbol = &memberAccess.value().as<slang::ast::NamedValueExpression>().symbol;
    }
    else {
        symbol = expr.getSymbolReference();
    }

    if (symbol) {
        return symbol->name;
    }
    return {};
}